

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode formboundary(Curl_easy *data,char *buffer,size_t buflen)

{
  size_t buflen_local;
  char *buffer_local;
  Curl_easy *data_local;
  
  if (buflen < 0x29) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    memset(buffer,0x2d,0x18);
    Curl_rand_hex(data,(uchar *)(buffer + 0x18),0x11);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode formboundary(struct Curl_easy *data,
                             char *buffer, size_t buflen)
{
  /* 24 dashes and 16 hexadecimal digits makes 64 bit (18446744073709551615)
     combinations */
  if(buflen < 41)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  memset(buffer, '-', 24);
  Curl_rand_hex(data, (unsigned char *)&buffer[24], 17);

  return CURLE_OK;
}